

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char*,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<char*,char>> *this,align_spec *spec,char_writer *f)

{
  byte bVar1;
  char_type cVar2;
  uint uVar3;
  char_type *pcVar4;
  char __tmp;
  char_type *pcVar5;
  void *__s;
  size_t __len_1;
  ulong __n;
  size_t __len;
  ulong __n_00;
  
  uVar3 = spec->width_;
  if ((ulong)uVar3 < 2) {
    cVar2 = f->value;
    pcVar5 = *(char_type **)this;
    *(char_type **)this = pcVar5 + 1;
    *pcVar5 = cVar2;
    return;
  }
  bVar1 = (byte)spec->fill_;
  __n_00 = (ulong)uVar3 - 1;
  if (spec->align_ == ALIGN_CENTER) {
    __n = __n_00 >> 1;
    pcVar4 = *(char_type **)this;
    pcVar5 = pcVar4;
    if (uVar3 != 2) {
      pcVar5 = pcVar4 + __n;
      memset(pcVar4,(uint)bVar1,__n);
    }
    *(char_type **)this = pcVar5;
    cVar2 = f->value;
    *(char_type **)this = pcVar5 + 1;
    *pcVar5 = cVar2;
    __s = *(void **)this;
    if (__n_00 == 0) goto LAB_00195ea8;
    __n_00 = __n_00 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar4 = *(char_type **)this;
      pcVar5 = pcVar4;
      if (__n_00 != 0) {
        pcVar5 = pcVar4 + __n_00;
        memset(pcVar4,(uint)bVar1,__n_00);
      }
      *(char_type **)this = pcVar5;
      cVar2 = f->value;
      *(char_type **)this = pcVar5 + 1;
      *pcVar5 = cVar2;
      return;
    }
    cVar2 = f->value;
    pcVar5 = *(char_type **)this;
    *(char_type **)this = pcVar5 + 1;
    *pcVar5 = cVar2;
    __s = *(void **)this;
    if (__n_00 == 0) goto LAB_00195ea8;
  }
  memset(__s,(uint)bVar1,__n_00);
  __s = (void *)((long)__s + __n_00);
LAB_00195ea8:
  *(void **)this = __s;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }